

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManVecNormal(float *pVec,int nDims)

{
  ulong uVar1;
  double dVar2;
  
  if (0 < nDims) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (double)(pVec[uVar1] * pVec[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)nDims != uVar1);
    dVar2 = pow(dVar2,0.5);
    if (0 < nDims) {
      uVar1 = 0;
      do {
        pVec[uVar1] = (float)((double)pVec[uVar1] / dVar2);
        uVar1 = uVar1 + 1;
      } while ((uint)nDims != uVar1);
    }
  }
  return;
}

Assistant:

void Emb_ManVecNormal( float * pVec, int nDims )
{
    int i;
    double Norm = 0.0;
    for ( i = 0; i < nDims; i++ )
        Norm += pVec[i] * pVec[i];
    Norm = pow( Norm, 0.5 );
    for ( i = 0; i < nDims; i++ )
        pVec[i] /= Norm;
}